

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

void __thiscall BigInt::operator+=(BigInt *this,BigInt *that)

{
  BigInt local_30;
  
  operator+(&local_30,this,that);
  operator=(this,&local_30);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_30);
  return;
}

Assistant:

void operator+=(const BigInt &that) {
        *this = *this + that;
    }